

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_base64_decode(char *src,size_t src_len,uchar *dst,size_t *dst_len)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uchar uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  if (dst_len == (size_t *)0x0) {
    sVar6 = 0xffffffffffffffff;
  }
  else {
    sVar6 = *dst_len;
    *dst_len = 0;
  }
  if (src_len == 0) {
    uVar8 = 0;
  }
  else {
    uVar10 = 0;
    uVar7 = 0;
    do {
      bVar1 = b64reverse(src[uVar10]);
      if (0xfd < bVar1) goto LAB_0010ebec;
      if (uVar10 + 1 < src_len) {
        cVar2 = src[uVar10 + 1];
      }
      else {
        cVar2 = '\0';
      }
      bVar3 = b64reverse(cVar2);
      iVar9 = (int)uVar10;
      if (0xfd < bVar3) {
        uVar10 = (ulong)(iVar9 + 1);
        goto LAB_0010ebec;
      }
      if (uVar10 + 2 < src_len) {
        cVar2 = src[uVar10 + 2];
      }
      else {
        cVar2 = '\0';
      }
      bVar4 = b64reverse(cVar2);
      if (bVar4 == 0xfe) {
        uVar10 = (ulong)(iVar9 + 2);
        goto LAB_0010ebec;
      }
      if (uVar10 + 3 < src_len) {
        cVar2 = src[uVar10 + 3];
      }
      else {
        cVar2 = '\0';
      }
      uVar5 = b64reverse(cVar2);
      if (uVar5 == 0xfe) {
        uVar10 = (ulong)(iVar9 + 3);
        goto LAB_0010ebec;
      }
      if (uVar7 < sVar6) {
        dst[uVar7] = (bVar3 >> 4) + bVar1 * '\x04';
      }
      uVar8 = uVar7 + 1;
      if (bVar4 != 0xff) {
        if (uVar8 < sVar6) {
          dst[uVar8] = (bVar4 >> 2) + bVar3 * '\x10';
        }
        uVar8 = uVar7 + 2;
        if (uVar5 != 0xff) {
          if (uVar8 < sVar6) {
            dst[uVar8] = uVar5 + bVar4 * '@';
          }
          uVar8 = uVar7 + 3;
        }
      }
      uVar10 = uVar10 + 4;
      uVar7 = uVar8;
    } while (uVar10 < src_len);
  }
  if (uVar8 < sVar6) {
    dst[uVar8] = '\0';
  }
  if (dst_len != (size_t *)0x0) {
    *dst_len = uVar8 + 1;
  }
  uVar10 = (ulong)((sVar6 < uVar8 + 1) - 1);
LAB_0010ebec:
  return (int)uVar10;
}

Assistant:

CIVETWEB_API int
mg_base64_decode(const char *src,
                 size_t src_len,
                 unsigned char *dst,
                 size_t *dst_len)
{
	size_t i;
	unsigned char a, b, c, d;
	size_t dst_len_limit = (size_t)-1;
	size_t dst_len_used = 0;

	if (dst_len != NULL) {
		dst_len_limit = *dst_len;
		*dst_len = 0;
	}

	for (i = 0; i < src_len; i += 4) {
		/* Read 4 characters from BASE64 string */
		a = b64reverse(src[i]);
		if (a >= 254) {
			return (int)i;
		}

		b = b64reverse(((i + 1) >= src_len) ? 0 : src[i + 1]);
		if (b >= 254) {
			return (int)i + 1;
		}

		c = b64reverse(((i + 2) >= src_len) ? 0 : src[i + 2]);
		if (c == 254) {
			return (int)i + 2;
		}

		d = b64reverse(((i + 3) >= src_len) ? 0 : src[i + 3]);
		if (d == 254) {
			return (int)i + 3;
		}

		/* Add first (of 3) decoded character */
		if (dst_len_used < dst_len_limit) {
			dst[dst_len_used] = (unsigned char)((unsigned char)(a << 2)
			                                    + (unsigned char)(b >> 4));
		}
		dst_len_used++;

		if (c != 255) {
			if (dst_len_used < dst_len_limit) {

				dst[dst_len_used] = (unsigned char)((unsigned char)(b << 4)
				                                    + (unsigned char)(c >> 2));
			}
			dst_len_used++;
			if (d != 255) {
				if (dst_len_used < dst_len_limit) {
					dst[dst_len_used] =
					    (unsigned char)((unsigned char)(c << 6) + d);
				}
				dst_len_used++;
			}
		}
	}

	/* Add terminating zero */
	if (dst_len_used < dst_len_limit) {
		dst[dst_len_used] = '\0';
	}
	dst_len_used++;
	if (dst_len != NULL) {
		*dst_len = dst_len_used;
	}

	if (dst_len_used > dst_len_limit) {
		/* Out of memory */
		return 0;
	}

	/* Return -1 for "OK" */
	return -1;
}